

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O1

void lsvm::object::free_package(package *pkg)

{
  void *ptr;
  entry *peVar1;
  iterator it;
  iterator local_40;
  
  hashmap::get_iterator(&local_40,pkg->classes);
  peVar1 = hashmap::next(&local_40);
  if (peVar1 != (entry *)0x0) {
    do {
      ptr = peVar1->val;
      hashmap::free(*(void **)((long)ptr + 0x18));
      memory::retain(ptr);
      peVar1 = hashmap::next(&local_40);
    } while (peVar1 != (entry *)0x0);
  }
  hashmap::free(pkg->classes);
  memory::retain(pkg);
  return;
}

Assistant:

void free_package(package* pkg){
    lsvm::hashmap::iterator it = lsvm::hashmap::get_iterator(pkg->classes);
    lsvm::hashmap::entry* e;
    while((e = lsvm::hashmap::next(&it)) != null){
        lsvm::object::free_class((object_class*)e->val);    
    }
    lsvm::symbol::free_symbolmap(pkg->classes);
    lsvm::memory::retain(pkg);
}